

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  CType *pCVar1;
  CType *pCVar2;
  ushort uVar3;
  CTypeID CVar4;
  CPscl CVar5;
  CTypeID ctypeid;
  CTypeID CVar6;
  CTInfo CVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  CTSize CVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  CTInfo CVar19;
  CTypeID CVar20;
  bool bVar21;
  CType *ct;
  CPDecl decl;
  CType *local_9f0;
  uint local_9e4;
  long local_9e0;
  CType *local_9d8;
  CPDecl local_9d0;
  
  CVar4 = cp_struct_name(cp,sdecl,sinfo);
  if (cp->tok == 0x7b) {
    cp_next(cp);
    CVar6 = CVar4;
    if (cp->tok != 0x7d) {
      bVar21 = false;
LAB_00147f36:
      CVar5 = cp_decl_spec(cp,&local_9d0,0x20000);
      local_9d0.mode = 4;
      CVar20 = CVar6;
      if (CVar5 == 0) {
        local_9d0.mode = 0xe;
      }
      do {
        if (bVar21) {
          cp_err_token(cp,0x7d);
        }
        local_9d0.bits = 0xffffffff;
        cp_declarator(cp,&local_9d0);
        ctypeid = cp_decl_intern(cp,&local_9d0);
        if ((CVar5 >> 0x11 & 1) == 0) {
          CVar6 = lj_ctype_new(cp->cts,&local_9f0);
          pCVar2 = cp->cts->tab;
          uVar15 = pCVar2[ctypeid].info;
          pCVar1 = pCVar2 + ctypeid;
          if (local_9d0.bits == 0xffffffff) {
            bVar21 = false;
            if ((uVar15 & 0xf0000000) == 0x30000000) {
              bVar21 = pCVar1->size == 0xffffffff;
            }
            CVar14 = 0x7f;
            if (local_9d0.name != (GCstr *)0x0) goto LAB_00148087;
            if ((uVar15 & 0xf0000000) != 0x50000000 && (uVar15 & 0xf0100000) != 0x10000000) {
              cp_err_token(cp,0x100);
            }
            local_9f0->info = ctypeid + 0x80030000;
            uVar15 = local_9d0.attr | 0x80000000;
            if ((pCVar1->info & 0xf0000000) != 0x10000000) {
              uVar15 = 0;
            }
            local_9f0->size = uVar15;
          }
          else {
            if (((uVar15 & 0xf4000000) != 0) ||
               (((local_9d0.bits == 0 && (local_9d0.name != (GCstr *)0x0)) ||
                (uVar12 = pCVar1->size << 3, 0x20 < uVar12)))) {
LAB_0014843d:
              cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
            }
            if (0x7ffffff < uVar15) {
              uVar12 = 1;
            }
            bVar21 = false;
            CVar14 = local_9d0.bits;
            if (uVar12 < local_9d0.bits) goto LAB_0014843d;
LAB_00148087:
            local_9f0->info = ctypeid + CVar14 * 0x10000 + 0x90000000;
            local_9f0->size = local_9d0.attr;
            if (local_9d0.name != (GCstr *)0x0) {
              (local_9d0.name)->marked = (local_9d0.name)->marked | 0x20;
              (local_9f0->name).gcptr64 = (uint64_t)local_9d0.name;
            }
          }
          pCVar2[CVar20].sib = (CTypeID1)CVar6;
        }
        else {
          CVar6 = cp_decl_constinit(cp,&local_9f0,ctypeid);
          cp->cts->tab[CVar20].sib = (CTypeID1)CVar6;
          (local_9d0.name)->marked = (local_9d0.name)->marked | 0x20;
          (local_9f0->name).gcptr64 = (uint64_t)local_9d0.name;
          bVar21 = false;
        }
        if (cp->tok != 0x2c) goto LAB_0014815b;
        cp_next(cp);
        local_9d0.pos = local_9d0.specpos;
        local_9d0.top = local_9d0.specpos + 1;
        local_9d0.stack[local_9d0.specpos].next = 0;
        local_9d0.attr = local_9d0.specattr;
        local_9d0.fattr = local_9d0.specfattr;
        local_9d0.name = (GCstr *)0x0;
        local_9d0.redir = (GCstr *)0x0;
        CVar20 = CVar6;
      } while( true );
    }
LAB_00148173:
    cp_check(cp,0x7d);
    cp->cts->tab[CVar6].sib = 0;
    cp_decl_attributes(cp,sdecl);
    local_9e4 = sdecl->attr;
    uVar15 = local_9e4 >> 0x10 & 0xf;
    local_9d8 = cp->cts->tab;
    uVar8 = (ulong)CVar4;
    local_9e0 = uVar8 * 3;
    CVar19 = local_9d8[uVar8].info;
    uVar3 = local_9d8[uVar8].sib;
    if (uVar3 == 0) {
      uVar12 = 0;
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      uVar12 = 0;
      do {
        pCVar1 = cp->cts->tab + uVar3;
        uVar13 = pCVar1->size;
        if (((pCVar1->info & 0xf0000000) == 0x90000000) ||
           (uVar13 != 0 && (pCVar1->info & 0xf0ff0000) == 0x80030000)) {
          CVar7 = lj_ctype_info(cp->cts,(uint)(ushort)pCVar1->info,&local_9d0.top);
          if ((0x1fffffff < local_9d0.top) ||
             ((uVar11 = local_9d0.top * 8, ~uVar18 < uVar11 || ((CVar7 & 0x100000) != 0)))) {
            if ((local_9d0.top != 0xffffffff) ||
               (((CVar7 & 0xf0000000) != 0x30000000 || ((CVar19 & 0x800000) != 0)))) {
              cp_err(cp,LJ_ERR_FFI_INVSIZE);
            }
            local_9d0.top = 0;
            uVar11 = 0;
          }
          if ((((uVar13 | local_9e4) & 2) != 0) ||
             ((uVar16 = CVar7 >> 0x10 & 0xf, (uVar13 & 1) != 0 && (uVar16 < (uVar13 >> 0x10 & 0xf)))
             )) {
            uVar16 = uVar13 >> 0x10 & 0xf;
          }
          uVar9 = (uint)cp->packstack[cp->curpack];
          if (uVar16 < cp->packstack[cp->curpack]) {
            uVar9 = uVar16;
          }
          if (uVar15 < uVar9) {
            uVar15 = uVar9;
          }
          iVar17 = 8 << ((byte)uVar9 & 0x1f);
          uVar16 = iVar17 - 1;
          uVar9 = pCVar1->info;
          uVar10 = uVar9 >> 0x10 & 0x7f;
          if ((uVar9 & 0xf0000000) == 0x90000000 && uVar10 != 0x7f) {
            if (((uVar13 & 1) != 0 || uVar10 == 0) ||
               ((((uVar13 | local_9e4) & 2) == 0 && (uVar11 < (uVar16 & uVar18) + uVar10)))) {
              uVar18 = -iVar17 & uVar18 + uVar16;
            }
            if ((uVar10 == uVar11) && ((uVar16 & uVar18) == 0)) {
              pCVar1->info = uVar9 & 0x9000ffff;
              uVar11 = uVar10;
              uVar13 = uVar18;
            }
            else {
              pCVar1->info = uVar10 * 0x100 + uVar11 * 0x2000 + (CVar7 & 0xb800000) +
                             (uVar11 - 1 & uVar18) + 0xa0000000;
              uVar13 = -uVar11;
              uVar11 = uVar10;
              uVar13 = uVar13 & uVar18;
            }
          }
          else {
            uVar18 = -iVar17 & uVar16 + uVar18;
            uVar13 = uVar18;
          }
          uVar16 = uVar12;
          if (uVar12 < uVar11) {
            uVar16 = uVar11;
          }
          pCVar1->size = uVar13 >> 3;
          if ((CVar19 >> 0x17 & 1) != 0) {
            uVar11 = 0;
            uVar12 = uVar16;
          }
          uVar18 = uVar18 + uVar11;
          CVar19 = CVar7 & 0x3100000 | CVar19;
        }
        uVar3 = pCVar1->sib;
      } while (uVar3 != 0);
    }
    (&local_9d8->info)[local_9e0 * 2] = uVar15 * 0x10000 + CVar19;
    if ((CVar19 >> 0x17 & 1) == 0) {
      uVar12 = uVar18;
    }
    iVar17 = 8 << ((byte)uVar15 & 0x1f);
    (&local_9d8->info + local_9e0 * 2)[1] = (-iVar17 & (iVar17 + uVar12) - 1) >> 3;
  }
  return CVar4;
LAB_0014815b:
  cp_check(cp,0x3b);
  if (cp->tok == 0x7d) goto LAB_00148173;
  goto LAB_00147f36;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}